

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

string * __thiscall
duckdb::IntegralCompressFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,LogicalType *result_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  LogicalTypeId type;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"__internal_compress_integral_%s",&local_71);
  LogicalTypeIdToString_abi_cxx11_(&local_70,(duckdb *)(ulong)(byte)*this,type);
  StringUtil::Lower(&local_50,&local_70);
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,(string *)&local_50,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

static string IntegralCompressFunctionName(const LogicalType &result_type) {
	return StringUtil::Format("__internal_compress_integral_%s",
	                          StringUtil::Lower(LogicalTypeIdToString(result_type.id())));
}